

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

bool phosg::pid_is_zombie(pid_t pid)

{
  int __fd;
  ssize_t sVar1;
  char *pcVar2;
  size_t sVar3;
  runtime_error *this;
  bool bVar4;
  scoped_fd fd;
  string filename;
  char status_data [2048];
  scoped_fd local_88c;
  string local_888;
  string local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  char local_828 [2056];
  
  string_printf_abi_cxx11_(&local_888,"/proc/%d/status",pid);
  scoped_fd::scoped_fd(&local_88c,(string *)&local_888,0,0x1ed);
  __fd = scoped_fd::operator_cast_to_int(&local_88c);
  sVar1 = ::read(__fd,local_828,0x7ff);
  if (-1 < sVar1) {
    local_828[sVar1] = '\0';
    scoped_fd::~scoped_fd(&local_88c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_888._M_dataplus._M_p != &local_888.field_2) {
      operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = strstr(local_828,"\nState:");
    if (pcVar2 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      sVar3 = skip_whitespace(pcVar2 + 7,0);
      bVar4 = pcVar2[sVar3 + 7] == 'Z';
    }
    return bVar4;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::to_string(&local_868,pid);
  ::std::operator+(&local_848,"can\'t read stat file for pid ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_868);
  ::std::runtime_error::runtime_error(this,(string *)&local_848);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool pid_is_zombie(pid_t pid) {
  // so many syscalls... sigh
  char status_data[2048]; // this is probably big enough
  try {
    string filename = string_printf("/proc/%d/status", pid);
    scoped_fd fd(filename, O_RDONLY);
    ssize_t bytes_read = ::read(fd, status_data, 2047);
    if (bytes_read < 0) {
      throw runtime_error("can\'t read stat file for pid " + to_string(pid));
    }
    status_data[bytes_read] = '\0';
  } catch (const cannot_open_file& e) {
    return false; // non-running processes are not zombies
  }

  char* state = strstr(status_data, "\nState:");
  if (!state) {
    return false;
  }

  state += skip_whitespace(state + 7, 0) + 7; // +7 to skip over "\nState:"
  return (*state == 'Z');
}